

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_history.cpp
# Opt level: O2

void __thiscall libtorrent::aux::timestamp_history::adjust_base(timestamp_history *this,int change)

{
  bool bVar1;
  array<unsigned_int,_20UL> *__range2;
  long lVar2;
  
  this->m_base = this->m_base + change;
  for (lVar2 = 0; lVar2 != 0x50; lVar2 = lVar2 + 4) {
    bVar1 = compare_less_wrap(*(uint32_t *)((long)(this->m_history)._M_elems + lVar2),this->m_base,
                              0xffffffff);
    if (bVar1) {
      *(uint32_t *)((long)(this->m_history)._M_elems + lVar2) = this->m_base;
    }
  }
  return;
}

Assistant:

void timestamp_history::adjust_base(int change)
{
	TORRENT_ASSERT(initialized());
	m_base += aux::numeric_cast<std::uint32_t>(change);
	// make sure this adjustment sticks by updating all history slots
	for (auto& h : m_history)
	{
		if (compare_less_wrap(h, m_base, TIME_MASK))
			h = m_base;
	}
}